

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

bool __thiscall CRPCTable::removeCommand(CRPCTable *this,string *name,CRPCCommand *pcmd)

{
  bool bVar1;
  iterator iVar2;
  __normal_iterator<const_CRPCCommand_**,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
  _Var3;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  CRPCCommand *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = pcmd;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->mapCommands)._M_t._M_impl.super__Rb_tree_header) {
    _Var3 = std::
            __remove_if<__gnu_cxx::__normal_iterator<CRPCCommand_const**,std::vector<CRPCCommand_const*,std::allocator<CRPCCommand_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<CRPCCommand_const*const>>
                      (*(CRPCCommand ***)(iVar2._M_node + 2),
                       (__normal_iterator<const_CRPCCommand_**,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
                        )iVar2._M_node[2]._M_parent,&local_20);
    if (iVar2._M_node[2]._M_parent != (_Base_ptr)_Var3._M_current) {
      p_Var4 = (_Base_ptr)
               ((long)_Var3._M_current +
               ((long)iVar2._M_node[2]._M_parent - (long)iVar2._M_node[2]._M_parent));
      bVar1 = true;
      if (iVar2._M_node[2]._M_parent != p_Var4) {
        iVar2._M_node[2]._M_parent = p_Var4;
      }
      goto LAB_003be4c4;
    }
  }
  bVar1 = false;
LAB_003be4c4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CRPCTable::removeCommand(const std::string& name, const CRPCCommand* pcmd)
{
    auto it = mapCommands.find(name);
    if (it != mapCommands.end()) {
        auto new_end = std::remove(it->second.begin(), it->second.end(), pcmd);
        if (it->second.end() != new_end) {
            it->second.erase(new_end, it->second.end());
            return true;
        }
    }
    return false;
}